

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

MatcherBase<absl::lts_20250127::LogSeverity> * __thiscall
testing::internal::MatcherBase<absl::lts_20250127::LogSeverity>::operator=
          (MatcherBase<absl::lts_20250127::LogSeverity> *this,
          MatcherBase<absl::lts_20250127::LogSeverity> *other)

{
  if (this != other) {
    Destroy(this);
    this->vtable_ = other->vtable_;
    this->buffer_ = other->buffer_;
    other->vtable_ = (VTable *)0x0;
  }
  return this;
}

Assistant:

MatcherBase& operator=(MatcherBase&& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    other.vtable_ = nullptr;
    return *this;
  }